

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O2

void __thiscall QSynth::setReverbEnabled(QSynth *this,bool reverbEnabled)

{
  QMutexLocker<QMutex> synthLocker;
  QMutexLocker<QMutex> local_20;
  
  if (this->realtimeHelper != (RealtimeHelper *)0x0) {
    RealtimeHelper::setReverbEnabled(this->realtimeHelper,reverbEnabled);
    return;
  }
  QMutexLocker<QMutex>::QMutexLocker(&local_20,this->synthMutex);
  if (this->state == SynthState_OPEN) {
    MT32Emu::Synth::setReverbEnabled(this->synth,reverbEnabled);
  }
  QMutexLocker<QMutex>::unlock(&local_20);
  return;
}

Assistant:

void QSynth::setReverbEnabled(bool reverbEnabled) {
	if (isRealtime()) {
		realtimeHelper->setReverbEnabled(reverbEnabled);
	} else {
		QMutexLocker synthLocker(synthMutex);
		if (isOpen()) synth->setReverbEnabled(reverbEnabled);
	}
}